

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashsearch.h
# Opt level: O2

string * hashStr(string *__return_storage_ptr__,string *param_1,size_t n,string *default_value,
                string *map_name,string *key_type,bool nonKeyLookups)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  string local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  hashStr_abi_cxx11_(&local_50,(uint32_t)param_1);
  std::operator+(&local_110,&local_50,"\n    static inline uint32_t hash(const ");
  std::operator+(&local_f0,&local_110,key_type);
  std::operator+(&local_d0,&local_f0,
                 "& key) noexcept{\n        uint32_t h = 0;\n\n        for(size_t i = key.size()-1; i < std::numeric_limits<size_t>::max(); i--)\n            h ^= hash(key[i]);\n\n        return h;\n    }\n};\n\nstd::string_view "
                );
  std::operator+(&local_b0,&local_d0,map_name);
  std::operator+(&local_90,&local_b0,"::lookup(const ");
  std::operator+(&local_70,&local_90,key_type);
  std::operator+(&local_170,&local_70,"& key) noexcept{\n    const size_t h = hash(key) & ");
  std::__cxx11::to_string(&local_130,n);
  std::operator+(&local_150,&local_170,&local_130);
  std::operator+(__return_storage_ptr__,&local_150,";\n");
  std::__cxx11::string::~string((string *)&local_150);
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)&local_110);
  std::__cxx11::string::~string((string *)&local_50);
  if (nonKeyLookups) {
    std::operator+(&local_170,
                   "    return checkBin(key, h) ? std::string_view(&flat_vals[val_start[h]], val_size[h]) : \""
                   ,default_value);
    std::operator+(&local_150,&local_170,"\";\n");
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_150);
    std::__cxx11::string::~string((string *)&local_170);
  }
  else {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string hashStr(const std::string&, size_t n, const std::string& default_value, std::string map_name, std::string key_type, bool nonKeyLookups){
    std::string hash = hashStr(uint32_t()) + "\n"
"    static inline uint32_t hash(const " + key_type + "& key) noexcept{\n"
"        uint32_t h = 0;\n"
"\n"
"        for(size_t i = key.size()-1; i < std::numeric_limits<size_t>::max(); i--)\n"
"            h ^= hash(key[i]);\n"
"\n"
"        return h;\n"
"    }\n"
"};\n"
"\n"
"std::string_view " + map_name + "::lookup(const " + key_type + "& key) noexcept{\n"
"    const size_t h = hash(key) & " + std::to_string(n) + ";\n";
    if(nonKeyLookups) hash +=
"    return checkBin(key, h) ? std::string_view(&flat_vals[val_start[h]], val_size[h]) : \"" + default_value + "\";\n";
    else hash +=
"    #ifndef NDEBUG\n"
"    assert(checkBin(key, h));\n"
"    #endif\n\n"
"    return std::string_view(&flat_vals[val_start[h]], val_size[h]);\n";

    hash += "}\n\n";

    return hash;
}